

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.cpp
# Opt level: O3

Scale * icu_63::number::Scale::byDoubleAndPowerOfTen
                  (Scale *__return_storage_ptr__,double multiplicand,int32_t power)

{
  DecNum *this;
  undefined4 in_register_00000034;
  UErrorCode *status;
  UErrorCode *pUVar1;
  DecNum *p;
  UErrorCode localError;
  UErrorCode local_2c;
  DecNum *local_28;
  double local_20;
  
  status = (UErrorCode *)CONCAT44(in_register_00000034,power);
  pUVar1 = (UErrorCode *)(ulong)(uint)power;
  local_2c = U_ZERO_ERROR;
  local_20 = multiplicand;
  this = (DecNum *)UMemory::operator_new((UMemory *)0x60,(size_t)status);
  if (this == (DecNum *)0x0) {
    local_2c = U_MEMORY_ALLOCATION_ERROR;
    __return_storage_ptr__->fMagnitude = 0;
    __return_storage_ptr__->fArbitrary = (DecNum *)0x0;
    __return_storage_ptr__->fError = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    impl::DecNum::DecNum(this);
    status = &local_2c;
    local_28 = this;
    impl::DecNum::setTo(this,local_20,status);
    if (U_ZERO_ERROR < local_2c) {
      __return_storage_ptr__->fMagnitude = 0;
      __return_storage_ptr__->fArbitrary = (DecNum *)0x0;
      __return_storage_ptr__->fError = local_2c;
      MaybeStackHeaderAndArray<decNumber,_char,_34>::~MaybeStackHeaderAndArray
                ((MaybeStackHeaderAndArray<decNumber,_char,_34> *)this);
      goto LAB_00274e17;
    }
    local_28 = (DecNum *)0x0;
    Scale(__return_storage_ptr__,power,this);
    status = pUVar1;
  }
  this = (DecNum *)0x0;
LAB_00274e17:
  UMemory::operator_delete((UMemory *)this,status);
  return __return_storage_ptr__;
}

Assistant:

Scale Scale::byDoubleAndPowerOfTen(double multiplicand, int32_t power) {
    UErrorCode localError = U_ZERO_ERROR;
    LocalPointer<DecNum> decnum(new DecNum(), localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    decnum->setTo(multiplicand, localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    return {power, decnum.orphan()};
}